

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

bool __thiscall
CoreML::Specification::NetworkUpdateParameters::MergePartialFromCodedStream
          (NetworkUpdateParameters *this,CodedInputStream *input)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  uint8 *puVar4;
  bool bVar5;
  int length;
  int iVar6;
  uint32 uVar7;
  Type *this_00;
  Int64Parameter *this_01;
  BoolParameter *this_02;
  Optimizer *this_03;
  pair<int,_int> pVar8;
  char cVar9;
  uint uVar10;
  ulong uVar11;
  
  do {
    pbVar3 = input->buffer_;
    uVar7 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar2 = *pbVar3;
      uVar11 = (ulong)bVar2;
      pbVar1 = pbVar3 + 1;
      uVar10 = (uint)bVar2;
      if ((char)bVar2 < '\x01') {
        uVar7 = (uint)bVar2;
        if ((input->buffer_end_ <= pbVar1) || (uVar7 = uVar10, (~(uint)*pbVar1 & uVar10) < 0x80))
        goto LAB_002362e7;
        uVar11 = (ulong)((uVar10 + (uint)*pbVar1 * 0x80) - 0x80);
        input->buffer_ = pbVar3 + 2;
      }
      else {
        input->buffer_ = pbVar1;
      }
      uVar11 = uVar11 | 0x100000000;
    }
    else {
LAB_002362e7:
      uVar7 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar7);
      uVar11 = 0;
      if (uVar7 - 1 < 0x3fff) {
        uVar11 = 0x100000000;
      }
      uVar11 = uVar7 | uVar11;
    }
    uVar7 = (uint32)uVar11;
    if ((uVar11 & 0x100000000) == 0) goto switchD_002360b8_caseD_4;
    uVar10 = (uint)(uVar11 >> 3) & 0x1fffffff;
    cVar9 = (char)uVar11;
    switch(uVar10) {
    case 1:
      if (cVar9 != '\n') break;
      this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
                Add<google::protobuf::RepeatedPtrField<CoreML::Specification::LossLayer>::TypeHandler>
                          (&(this->losslayers_).super_RepeatedPtrFieldBase,(Type *)0x0);
      puVar4 = input->buffer_;
      if ((puVar4 < input->buffer_end_) && (iVar6 = (int)(char)*puVar4, -1 < iVar6)) {
        input->buffer_ = puVar4 + 1;
      }
      else {
        iVar6 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar6 < 0) {
          return false;
        }
      }
      pVar8 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                        (input,iVar6);
      if ((long)pVar8 < 0) {
        return false;
      }
      bVar5 = LossLayer::MergePartialFromCodedStream(this_00,input);
LAB_002362ce:
      if (bVar5 == false) {
        return false;
      }
      bVar5 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                        (input,pVar8.first);
      goto LAB_002362dd;
    case 2:
      if (cVar9 == '\x12') {
        this_03 = this->optimizer_;
        if (this_03 == (Optimizer *)0x0) {
          this_03 = (Optimizer *)operator_new(0x20);
          Optimizer::Optimizer(this_03);
          this->optimizer_ = this_03;
        }
        puVar4 = input->buffer_;
        if ((puVar4 < input->buffer_end_) && (iVar6 = (int)(char)*puVar4, -1 < iVar6)) {
          input->buffer_ = puVar4 + 1;
        }
        else {
          iVar6 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
          if (iVar6 < 0) {
            return false;
          }
        }
        pVar8 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                          (input,iVar6);
        if ((long)pVar8 < 0) {
          return false;
        }
        bVar5 = Optimizer::MergePartialFromCodedStream(this_03,input);
        goto LAB_002362ce;
      }
      break;
    case 3:
      if (cVar9 == '\x1a') {
        this_01 = this->epochs_;
        if (this_01 == (Int64Parameter *)0x0) {
          this_01 = (Int64Parameter *)operator_new(0x28);
          Int64Parameter::Int64Parameter(this_01);
          this->epochs_ = this_01;
        }
LAB_0023614c:
        puVar4 = input->buffer_;
        if ((puVar4 < input->buffer_end_) && (iVar6 = (int)(char)*puVar4, -1 < iVar6)) {
          input->buffer_ = puVar4 + 1;
        }
        else {
          iVar6 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
          if (iVar6 < 0) {
            return false;
          }
        }
        pVar8 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                          (input,iVar6);
        if ((long)pVar8 < 0) {
          return false;
        }
        bVar5 = Int64Parameter::MergePartialFromCodedStream(this_01,input);
        goto LAB_002362ce;
      }
      break;
    case 4:
    case 5:
    case 6:
    case 7:
    case 8:
    case 9:
      break;
    case 10:
      if (cVar9 == 'R') {
        this_02 = this->shuffle_;
        if (this_02 == (BoolParameter *)0x0) {
          this_02 = (BoolParameter *)operator_new(0x18);
          BoolParameter::BoolParameter(this_02);
          this->shuffle_ = this_02;
        }
        puVar4 = input->buffer_;
        if ((puVar4 < input->buffer_end_) && (iVar6 = (int)(char)*puVar4, -1 < iVar6)) {
          input->buffer_ = puVar4 + 1;
        }
        else {
          iVar6 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
          if (iVar6 < 0) {
            return false;
          }
        }
        pVar8 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                          (input,iVar6);
        if ((long)pVar8 < 0) {
          return false;
        }
        bVar5 = BoolParameter::MergePartialFromCodedStream(this_02,input);
        goto LAB_002362ce;
      }
      break;
    default:
      if ((uVar10 == 0x14) && (cVar9 == -0x5e)) {
        this_01 = this->seed_;
        if (this_01 == (Int64Parameter *)0x0) {
          this_01 = (Int64Parameter *)operator_new(0x28);
          Int64Parameter::Int64Parameter(this_01);
          this->seed_ = this_01;
        }
        goto LAB_0023614c;
      }
    }
switchD_002360b8_caseD_4:
    if (uVar7 == 0) {
      return true;
    }
    if ((uVar7 & 7) == 4) {
      return true;
    }
    bVar5 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar7);
LAB_002362dd:
    if (bVar5 == false) {
      return false;
    }
  } while( true );
}

Assistant:

bool NetworkUpdateParameters::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.NetworkUpdateParameters)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // repeated .CoreML.Specification.LossLayer lossLayers = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_losslayers()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.Optimizer optimizer = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_optimizer()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.Int64Parameter epochs = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_epochs()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.BoolParameter shuffle = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(82u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_shuffle()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.Int64Parameter seed = 20;
      case 20: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(162u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_seed()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.NetworkUpdateParameters)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.NetworkUpdateParameters)
  return false;
#undef DO_
}